

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * Catch::runTests(Totals *__return_storage_ptr__,Ptr<Catch::Config> *config)

{
  bool bVar1;
  int iVar2;
  Config *pCVar3;
  undefined4 extraout_var;
  ITagAliasRegistry *tagAliases;
  TestSpecParser *this;
  IConfig *pIVar4;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *this_00;
  reference pTVar5;
  IStreamingReporter *pIVar6;
  string local_3a8 [32];
  Totals local_388;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_358;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *allTestCases;
  string local_338 [32];
  TestSpecParser local_318;
  TestSpec local_2a8;
  undefined1 local_290 [8];
  TestSpec testSpec;
  undefined1 local_258 [8];
  RunContext context;
  Ptr<Catch::IStreamingReporter> local_38 [3];
  Ptr<Catch::IStreamingReporter> local_20;
  Ptr<Catch::IStreamingReporter> reporter;
  Ptr<const_Catch::IConfig> iconfig;
  Ptr<Catch::Config> *config_local;
  
  pCVar3 = Ptr<Catch::Config>::get(config);
  Ptr<const_Catch::IConfig>::Ptr((Ptr<const_Catch::IConfig> *)&reporter,(IConfig *)pCVar3);
  makeReporter((Catch *)&local_20,config);
  Ptr<Catch::IStreamingReporter>::Ptr
            ((Ptr<Catch::IStreamingReporter> *)&context.m_trackerContext.m_runState,&local_20);
  addListeners((Catch *)local_38,(Ptr<const_Catch::IConfig> *)&reporter,
               (Ptr<Catch::IStreamingReporter> *)&context.m_trackerContext.m_runState);
  Ptr<Catch::IStreamingReporter>::operator=(&local_20,local_38);
  Ptr<Catch::IStreamingReporter>::~Ptr(local_38);
  Ptr<Catch::IStreamingReporter>::~Ptr
            ((Ptr<Catch::IStreamingReporter> *)&context.m_trackerContext.m_runState);
  RunContext::RunContext((RunContext *)local_258,(Ptr<const_Catch::IConfig> *)&reporter,&local_20);
  Totals::Totals(__return_storage_ptr__);
  pCVar3 = Ptr<Catch::Config>::operator->(config);
  (*(pCVar3->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[6])
            (&testSpec.m_filters.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  RunContext::testGroupStarting
            ((RunContext *)local_258,
             (string *)
             &testSpec.m_filters.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,1,1);
  std::__cxx11::string::~string
            ((string *)
             &testSpec.m_filters.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  pCVar3 = Ptr<Catch::Config>::operator->(config);
  iVar2 = (*(pCVar3->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  TestSpec::TestSpec((TestSpec *)local_290,(TestSpec *)CONCAT44(extraout_var,iVar2));
  bVar1 = TestSpec::hasFilters((TestSpec *)local_290);
  if (!bVar1) {
    tagAliases = ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser(&local_318,tagAliases);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_338,"~[.]",(allocator *)((long)&allTestCases + 7));
    this = TestSpecParser::parse(&local_318,(string *)local_338);
    TestSpecParser::testSpec(&local_2a8,this);
    TestSpec::operator=((TestSpec *)local_290,&local_2a8);
    TestSpec::~TestSpec(&local_2a8);
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator((allocator<char> *)((long)&allTestCases + 7));
    TestSpecParser::~TestSpecParser(&local_318);
  }
  pIVar4 = Ptr<const_Catch::IConfig>::operator*((Ptr<const_Catch::IConfig> *)&reporter);
  this_00 = getAllTestCasesSorted(pIVar4);
  itEnd = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(this_00);
  local_358._M_current =
       (TestCase *)std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=(&itEnd,&local_358);
    if (!bVar1) {
      pIVar4 = Ptr<const_Catch::IConfig>::operator->((Ptr<const_Catch::IConfig> *)&reporter);
      (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[6])(local_3a8);
      RunContext::testGroupEnded((RunContext *)local_258,local_3a8,__return_storage_ptr__,1,1);
      std::__cxx11::string::~string((string *)local_3a8);
      TestSpec::~TestSpec((TestSpec *)local_290);
      RunContext::~RunContext((RunContext *)local_258);
      Ptr<Catch::IStreamingReporter>::~Ptr(&local_20);
      Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)&reporter);
      return __return_storage_ptr__;
    }
    bVar1 = RunContext::aborting((RunContext *)local_258);
    if (bVar1) {
LAB_0017fd30:
      pIVar6 = Ptr<Catch::IStreamingReporter>::operator->(&local_20);
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&itEnd);
      (*(pIVar6->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])(pIVar6,pTVar5);
    }
    else {
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&itEnd);
      pIVar4 = Ptr<const_Catch::IConfig>::operator*((Ptr<const_Catch::IConfig> *)&reporter);
      bVar1 = matchTest(pTVar5,(TestSpec *)local_290,pIVar4);
      if (!bVar1) goto LAB_0017fd30;
      pTVar5 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&itEnd);
      RunContext::runTest(&local_388,(RunContext *)local_258,pTVar5);
      Totals::operator+=(__return_storage_ptr__,&local_388);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&itEnd);
  } while( true );
}

Assistant:

Totals runTests( Ptr<Config> const& config ) {

        Ptr<IConfig const> iconfig = config.get();

        Ptr<IStreamingReporter> reporter = makeReporter( config );
        reporter = addListeners( iconfig, reporter );

        RunContext context( iconfig, reporter );

        Totals totals;

        context.testGroupStarting( config->name(), 1, 1 );

        TestSpec testSpec = config->testSpec();
        if( !testSpec.hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

        std::vector<TestCase> const& allTestCases = getAllTestCasesSorted( *iconfig );
        for( std::vector<TestCase>::const_iterator it = allTestCases.begin(), itEnd = allTestCases.end();
                it != itEnd;
                ++it ) {
            if( !context.aborting() && matchTest( *it, testSpec, *iconfig ) )
                totals += context.runTest( *it );
            else
                reporter->skipTest( *it );
        }

        context.testGroupEnded( iconfig->name(), totals, 1, 1 );
        return totals;
    }